

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oaa.cc
# Opt level: O2

void predict_or_learn<false,false,true,false>(oaa *o,single_learner *base,example *ec)

{
  float fVar1;
  uint uVar2;
  ostream *poVar3;
  uint uVar4;
  uint uVar5;
  v_array<float> scores_array;
  stringstream outputStringStream;
  
  uVar2 = (ec->l).multi.label;
  fVar1 = (ec->l).simple.weight;
  if (((ulong)uVar2 == 0) || ((uVar2 != 0xffffffff && (o->k < (ulong)uVar2)))) {
    poVar3 = std::operator<<((ostream *)&std::cout,"label ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," is not in {1,");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&outputStringStream);
  scores_array._begin = (ec->pred).scalars._begin;
  scores_array._end = (ec->pred).scalars._end;
  scores_array.end_array = (ec->pred).scalars.end_array;
  scores_array.erase_count = (ec->pred).scalars.erase_count;
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  LEARNER::learner<char,_example>::multipredict(base,ec,0,o->k,o->pred,true);
  if (ec->passthrough != (features *)0x0) {
    uVar4 = 0;
    while( true ) {
      uVar5 = uVar4 + 1;
      if (o->k < (ulong)uVar5) break;
      add_passthrough_feature_magic(ec,0x398d4541,(ulong)uVar5,o->pred[uVar4].scalar);
      uVar4 = uVar5;
    }
  }
  v_array<float>::clear(&scores_array);
  for (uVar4 = 0; (ulong)uVar4 < o->k; uVar4 = uVar4 + 1) {
    v_array<float>::push_back(&scores_array,&o->pred[uVar4].scalar);
  }
  (ec->pred).scalars.end_array = scores_array.end_array;
  (ec->pred).scalars.erase_count = scores_array.erase_count;
  (ec->pred).scalars._begin = scores_array._begin;
  (ec->pred).scalars._end = scores_array._end;
  (ec->l).multi.label = uVar2;
  (ec->l).simple.weight = fVar1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&outputStringStream);
  return;
}

Assistant:

void predict_or_learn(oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTICLASS::label_t mc_label_data = ec.l.multi;
  if (mc_label_data.label == 0 || (mc_label_data.label > o.k && mc_label_data.label != (uint32_t)-1))
    cout << "label " << mc_label_data.label << " is not in {1," << o.k << "} This won't work right." << endl;

  stringstream outputStringStream;
  uint32_t prediction = 1;
  v_array<float> scores_array;
  if (scores)
    scores_array = ec.pred.scalars;

  ec.l.simple = {FLT_MAX, 0.f, 0.f};
  base.multipredict(ec, 0, o.k, o.pred, true);
  for (uint32_t i = 2; i <= o.k; i++)
    if (o.pred[i - 1].scalar > o.pred[prediction - 1].scalar)
      prediction = i;

  if (ec.passthrough)
    for (uint32_t i = 1; i <= o.k; i++) add_passthrough_feature(ec, i, o.pred[i - 1].scalar);

  if (is_learn)
  {
    for (uint32_t i = 1; i <= o.k; i++)
    {
      ec.l.simple = {(mc_label_data.label == i) ? 1.f : -1.f, 0.f, 0.f};
      ec.pred.scalar = o.pred[i - 1].scalar;
      base.update(ec, i - 1);
    }
  }

  if (print_all)
  {
    outputStringStream << "1:" << o.pred[0].scalar;
    for (uint32_t i = 2; i <= o.k; i++) outputStringStream << ' ' << i << ':' << o.pred[i - 1].scalar;
    o.all->print_text(o.all->raw_prediction, outputStringStream.str(), ec.tag);
  }

  if (scores)
  {
    scores_array.clear();
    for (uint32_t i = 0; i < o.k; i++) scores_array.push_back(o.pred[i].scalar);
    ec.pred.scalars = scores_array;

    if (probabilities)
    {
      float sum_prob = 0;
      for (uint32_t i = 0; i < o.k; i++)
      {
        ec.pred.scalars[i] = 1.f / (1.f + correctedExp(-o.pred[i].scalar));
        sum_prob += ec.pred.scalars[i];
      }
      float inv_sum_prob = 1.f / sum_prob;
      for (uint32_t i = 0; i < o.k; i++) ec.pred.scalars[i] *= inv_sum_prob;
    }
  }
  else
    ec.pred.multiclass = prediction;

  ec.l.multi = mc_label_data;
}